

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateCopyConstructorCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  (*(this->super_FieldGenerator)._vptr_FieldGenerator[0xf])
            (this,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar1 = HasHasbit((this->super_FieldGenerator).descriptor_);
  if (bVar1) {
    Formatter::operator()<>((Formatter *)local_50,"if (from._internal_has_$name$()) {\n");
  }
  else {
    Formatter::operator()<>((Formatter *)local_50,"if (!from._internal_$name$().empty()) {\n");
  }
  Formatter::Indent((Formatter *)local_50);
  if ((this->inlined_ & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$name$_.Set($default_value_tag$, from._internal_$name$(), \n  GetArenaForAllocation());\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$name$_.Set(nullptr, from._internal_$name$(),\n  GetArenaForAllocation(), _internal_$name$_donated(), &$donating_states_word$, $mask_for_undonate$);\n"
              );
  }
  Formatter::Outdent((Formatter *)local_50);
  Formatter::operator()<>((Formatter *)local_50,"}\n");
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateCopyConstructorCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  GenerateConstructorCode(printer);

  if (HasHasbit(descriptor_)) {
    format("if (from._internal_has_$name$()) {\n");
  } else {
    format("if (!from._internal_$name$().empty()) {\n");
  }

  format.Indent();

  if (!inlined_) {
    format(
        "$name$_.Set($default_value_tag$, from._internal_$name$(), \n"
        "  GetArenaForAllocation());\n");
  } else {
    format(
        "$name$_.Set(nullptr, from._internal_$name$(),\n"
        "  GetArenaForAllocation(), _internal_$name$_donated(), "
        "&$donating_states_word$, $mask_for_undonate$);\n");
  }

  format.Outdent();
  format("}\n");
}